

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-attitude-trajectory-reconstruction.hxx
# Opt level: O3

examples * __thiscall
stateObservation::examples::imuAttitudeTrajectoryReconstruction
          (examples *this,IndexedMatrixArray *y,IndexedMatrixArray *u,Vector *xh0,Matrix *p,
          Matrix *q,Matrix *r,double dt)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  void *pvVar5;
  DstEvaluatorType dstEvaluator;
  DenseStorage<double,__1,__1,__1,_0> *pDVar6;
  reference pMVar7;
  long lVar8;
  undefined1 (*__ptr) [16];
  undefined8 *puVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  IndexedMatrixArray *xh;
  Matrix c;
  Matrix a;
  Vector xhk;
  Vector dx;
  ExtendedKalmanFilter filter;
  IMUDynamicalSystem imuFunctor;
  assign_op<double,_double> local_5b1;
  IndexedMatrixArray *local_5b0;
  double local_5a8;
  void *local_5a0;
  long local_598;
  DenseStorage<double,__1,__1,__1,_0> local_588;
  undefined8 local_570;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_560;
  double local_558;
  void *local_550;
  long local_548;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_540;
  examples *local_538;
  double local_530;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_528;
  void *local_520 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_510;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  undefined8 uStack_4e0;
  code *local_4d0 [78];
  void *local_260;
  void *local_240;
  void *local_218;
  void *local_208;
  void *local_1f0;
  void *local_1d8;
  void *local_1c8;
  void *local_1b8;
  void *local_1a8;
  void *local_198;
  IMUDynamicalSystem local_188 [344];
  
  local_5b0 = u;
  local_5a8 = dt;
  ExtendedKalmanFilter::ExtendedKalmanFilter((ExtendedKalmanFilter *)local_4d0,0x12,6,6,false,true);
  stateObservation::IMUDynamicalSystem::IMUDynamicalSystem(local_188);
  stateObservation::IMUDynamicalSystem::setSamplingPeriod(local_5a8);
  stateObservation::ExtendedKalmanFilter::setFunctor((DynamicalSystemFunctorBase *)local_4d0);
  stateObservation::ZeroDelayObserver::setState((Matrix *)local_4d0,(uint)xh0);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)local_4d0);
  uVar15 = 0xffffffff;
  if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 + (ulong)(*(long *)(y + 0x50) == 0)) *
      0x15 != (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
    uVar15 = *(int *)y - 1;
  }
  lVar11 = (*(long *)(local_5b0 + 0x28) - *(long *)(local_5b0 + 0x18) >> 3) * -0x5555555555555555 +
           (*(long *)(local_5b0 + 0x38) - *(long *)(local_5b0 + 0x40) >> 3) * -0x5555555555555555 +
           ((*(long *)(local_5b0 + 0x50) - *(long *)(local_5b0 + 0x30) >> 3) + -1 +
           (ulong)(*(long *)(local_5b0 + 0x50) == 0)) * 0x15;
  if (lVar11 == 0) {
LAB_0010728c:
    __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
  }
  uVar10 = *(uint *)local_5b0;
  if ((uVar15 < uVar10) || (lVar11 + (ulong)uVar10 <= (ulong)uVar15)) goto LAB_0010728c;
  local_540 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(local_5b0 + 0x18);
  pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)
           std::
           _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
           ::operator[](local_540,(ulong)(uVar15 - uVar10));
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_588,pDVar6);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5a0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_588);
  stateObservation::ZeroDelayObserver::setInput((Matrix *)local_4d0,(uint)&local_5a0);
  free(local_5a0);
  free(local_588.m_data);
  stateObservation::KalmanFilterBase::setR((Matrix *)local_4d0);
  stateObservation::KalmanFilterBase::setQ((Matrix *)local_4d0);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  if (local_598 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_588.m_rows = local_598;
  local_570 = 0x3e45798ee2308c3a;
  local_588.m_data = (double *)&local_5a0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_520,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_588);
  free(local_5a0);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_588,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)xh0);
  uVar15 = 0xffffffff;
  if ((*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
      ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 + (ulong)(*(long *)(y + 0x50) == 0)) *
      0x15 != (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * 0x5555555555555555) {
    uVar15 = *(int *)y - 1;
  }
  local_560 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(this + 0x18);
  lVar13 = (*(long *)(this + 0x38) - *(long *)(this + 0x40) >> 3) * -0x5555555555555555 +
           ((*(long *)(this + 0x50) - *(long *)(this + 0x30) >> 3) + -1 +
           (ulong)(*(long *)(this + 0x50) == 0)) * 0x15;
  lVar11 = *(long *)(this + 0x28) - *(long *)(this + 0x18) >> 3;
  lVar16 = lVar11 * -0x5555555555555555 + lVar13;
  if (lVar16 != 0) {
    uVar10 = *(uint *)this;
    uVar17 = lVar16 + (ulong)uVar10;
    if ((uVar10 <= uVar15) && (uVar15 < uVar17)) {
      pMVar7 = std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[](local_560,(ulong)(uVar15 - uVar10));
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (pMVar7,(Matrix<double,__1,__1,_0,__1,__1> *)&local_588,
                 (assign_op<double,_double> *)&local_5a0);
      goto LAB_00106c04;
    }
    if (uVar17 != uVar15) {
LAB_00107317:
      __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0xaa,
                    "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const");
    }
  }
  if (lVar13 == lVar11 * 0x5555555555555555) {
    *(uint *)this = uVar15;
  }
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)(this + 8),(value_type *)&local_588);
LAB_00106c04:
  local_528 = (_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
               *)(y + 0x18);
  free(local_588.m_data);
  lVar11 = *(long *)(y + 0x50);
  lVar13 = *(long *)(y + 0x30);
  lVar16 = *(long *)(y + 0x38);
  lVar19 = *(long *)(y + 0x40);
  lVar8 = *(long *)(y + 0x28);
  lVar20 = *(long *)(y + 0x18);
  uVar15 = *(uint *)y;
  dVar22 = (double)(ulong)uVar15;
  if ((lVar16 - lVar19 >> 3) * -0x5555555555555555 +
      ((lVar11 - lVar13 >> 3) + -1 + (ulong)(lVar11 == 0)) * 0x15 ==
      (lVar8 - lVar20 >> 3) * 0x5555555555555555) {
    dVar22 = 0.0;
  }
  local_538 = this + 8;
  do {
    lVar11 = (lVar8 - lVar20 >> 3) * -0x5555555555555555 +
             (lVar16 - lVar19 >> 3) * -0x5555555555555555 +
             ((lVar11 - lVar13 >> 3) + -1 + (ulong)(lVar11 == 0)) * 0x15;
    uVar10 = (uVar15 - 1) + (int)lVar11;
    if (lVar11 == 0) {
      uVar10 = 0;
    }
    uVar21 = SUB84(dVar22,0);
    if (uVar10 < uVar21) {
      free(local_520[0]);
      stateObservation::IMUDynamicalSystem::~IMUDynamicalSystem(local_188);
      local_4d0[0] = __cxa_guard_acquire;
      free(local_198);
      free(local_1a8);
      free(local_1b8);
      free(local_1c8);
      free(local_1d8);
      free(local_1f0);
      free(local_208);
      free(local_218);
      free(local_240);
      free(local_260);
      KalmanFilterBase::~KalmanFilterBase((KalmanFilterBase *)local_4d0);
      return this;
    }
    if (((lVar11 == 0) || (uVar21 < uVar15)) ||
       (local_5a8 = dVar22, lVar11 + (ulong)uVar15 <= (ulong)dVar22)) goto LAB_0010728c;
    pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)
             std::
             _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
             ::operator[](local_528,(ulong)(uVar21 - uVar15));
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_588,pDVar6);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5a0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_588);
    uVar15 = (uint)(PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5a0;
    stateObservation::ZeroDelayObserver::setMeasurement((Matrix *)local_4d0,uVar15);
    free(local_5a0);
    free(local_588.m_data);
    lVar11 = (*(long *)(y + 0x28) - *(long *)(y + 0x18) >> 3) * -0x5555555555555555 +
             (*(long *)(y + 0x38) - *(long *)(y + 0x40) >> 3) * -0x5555555555555555 +
             ((*(long *)(y + 0x50) - *(long *)(y + 0x30) >> 3) + -1 +
             (ulong)(*(long *)(y + 0x50) == 0)) * 0x15;
    if ((lVar11 != 0) && (uVar21 < ((int)lVar11 + *(int *)y) - 1U)) {
      lVar11 = (*(long *)(local_5b0 + 0x28) - *(long *)(local_5b0 + 0x18) >> 3) *
               -0x5555555555555555 +
               (*(long *)(local_5b0 + 0x38) - *(long *)(local_5b0 + 0x40) >> 3) *
               -0x5555555555555555 +
               ((*(long *)(local_5b0 + 0x50) - *(long *)(local_5b0 + 0x30) >> 3) + -1 +
               (ulong)(*(long *)(local_5b0 + 0x50) == 0)) * 0x15;
      if (lVar11 == 0) goto LAB_0010728c;
      uVar10 = *(uint *)local_5b0;
      if ((uVar21 < uVar10) || (lVar11 + (ulong)uVar10 <= (ulong)local_5a8)) goto LAB_0010728c;
      pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)
               std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[](local_540,(ulong)(uVar21 - uVar10));
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_588,pDVar6);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5a0,
                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_588);
      stateObservation::ZeroDelayObserver::setInput((Matrix *)local_4d0,uVar15);
      free(local_5a0);
      free(local_588.m_data);
    }
    stateObservation::ExtendedKalmanFilter::getAMatrixFD((Matrix *)&local_588);
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)&local_5a0);
    stateObservation::KalmanFilterBase::setA((Matrix *)local_4d0);
    stateObservation::KalmanFilterBase::setC((Matrix *)local_4d0);
    stateObservation::ZeroDelayObserver::getEstimatedState((uint)&local_550);
    pvVar5 = local_550;
    if (local_548 < 6) {
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    local_4f8 = *(double *)((long)local_550 + 0x18);
    dStack_4f0 = *(double *)((long)local_550 + 0x20);
    local_558 = *(double *)((long)local_550 + 0x28);
    dVar22 = local_558 * local_558 + dStack_4f0 * dStack_4f0 + local_4f8 * local_4f8;
    if (dVar22 <= 22.206609902451056) {
      __ptr = (undefined1 (*) [16])malloc(0x18);
      if (((ulong)__ptr & 0xf) != 0) goto LAB_001072ca;
      if (__ptr == (undefined1 (*) [16])0x0) goto LAB_001072e9;
      *(double *)*__ptr = local_4f8;
      *(double *)(*__ptr + 8) = dStack_4f0;
      *(double *)__ptr[1] = local_558;
    }
    else {
      local_4e8 = SQRT(dVar22);
      uStack_4e0 = 0;
      local_530 = ceil((local_4e8 + -3.141592653589793) / 6.283185307179586);
      __ptr = (undefined1 (*) [16])malloc(0x18);
      if (((ulong)__ptr & 0xf) != 0) {
LAB_001072ca:
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (__ptr == (undefined1 (*) [16])0x0) {
LAB_001072e9:
        puVar9 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar9 = stateObservation::ExtendedKalmanFilter::getCMatrixFD;
        __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      dVar22 = (double)(uint)((int)(long)local_530 * 2) * -3.141592653589793 + local_4e8;
      auVar4._8_8_ = dStack_4f0;
      auVar4._0_8_ = local_4f8;
      auVar23._8_8_ = local_4e8;
      auVar23._0_8_ = local_4e8;
      auVar23 = divpd(auVar4,auVar23);
      dVar2 = dVar22 * auVar23._8_8_;
      auVar1._8_4_ = SUB84(dVar2,0);
      auVar1._0_8_ = dVar22 * auVar23._0_8_;
      auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
      *__ptr = auVar1;
      *(double *)__ptr[1] = (local_558 / local_4e8) * dVar22;
    }
    uVar14 = (long)pvVar5 + 0x18;
    uVar17 = (ulong)((uint)(uVar14 >> 3) & 1);
    if ((uVar14 & 7) != 0) {
      uVar17 = 3;
    }
    uVar12 = uVar17 + (ulong)(1 < (uVar17 ^ 3)) * 2;
    if (uVar17 == 0) {
LAB_00107054:
      do {
        uVar3 = *(undefined8 *)((long)(*__ptr + uVar17 * 8) + 8);
        puVar9 = (undefined8 *)(uVar14 + uVar17 * 8);
        *puVar9 = *(undefined8 *)(*__ptr + uVar17 * 8);
        puVar9[1] = uVar3;
        uVar17 = uVar17 + 2;
      } while (uVar17 < uVar12);
    }
    else {
      uVar18 = 0;
      do {
        *(undefined8 *)(uVar14 + uVar18 * 8) = *(undefined8 *)(*__ptr + uVar18 * 8);
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
      if (1 < (uint)(uVar17 ^ 3)) goto LAB_00107054;
    }
    if ((uint)uVar12 < 3) {
      do {
        *(undefined8 *)(uVar14 + uVar12 * 8) = *(undefined8 *)(*__ptr + uVar12 * 8);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 3);
    }
    free(__ptr);
    stateObservation::ZeroDelayObserver::setState
              ((Matrix *)local_4d0,
               (uint)(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_550);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_510,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_550);
    lVar13 = (*(long *)(this + 0x38) - *(long *)(this + 0x40) >> 3) * -0x5555555555555555 +
             ((*(long *)(this + 0x50) - *(long *)(this + 0x30) >> 3) + -1 +
             (ulong)(*(long *)(this + 0x50) == 0)) * 0x15;
    lVar11 = *(long *)(this + 0x28) - *(long *)(this + 0x18) >> 3;
    lVar16 = lVar11 * -0x5555555555555555 + lVar13;
    if (lVar16 == 0) {
LAB_00107145:
      if (lVar13 == lVar11 * 0x5555555555555555) {
        *(uint *)this = uVar21;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_538,&local_510);
    }
    else {
      uVar15 = *(uint *)this;
      dVar22 = (double)(lVar16 + (ulong)uVar15);
      if ((uVar21 < uVar15) || ((ulong)dVar22 <= (ulong)local_5a8)) {
        if (dVar22 == local_5a8) goto LAB_00107145;
        goto LAB_00107317;
      }
      pMVar7 = std::
               _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
               ::operator[](local_560,(ulong)(uVar21 - uVar15));
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (pMVar7,&local_510,&local_5b1);
    }
    free(local_510.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free(local_550);
    free(local_5a0);
    free(local_588.m_data);
    dVar22 = (double)(ulong)(uVar21 + 1);
    lVar11 = *(long *)(y + 0x50);
    lVar13 = *(long *)(y + 0x30);
    lVar16 = *(long *)(y + 0x38);
    lVar19 = *(long *)(y + 0x40);
    lVar8 = *(long *)(y + 0x28);
    lVar20 = *(long *)(y + 0x18);
    uVar15 = *(uint *)y;
  } while( true );
}

Assistant:

IndexedMatrixArray imuAttitudeTrajectoryReconstruction
    (
    const IndexedMatrixArray & y,
    const IndexedMatrixArray & u,
    const Vector & xh0,
    const Matrix & p,
    const Matrix & q,
    const Matrix & r,
    double dt)
{
    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=6;

    ///initialization of the extended Kalman filter
    ExtendedKalmanFilter filter(stateSize, measurementSize, inputSize, false);

    ///initalization of the functor
    IMUDynamicalSystem imuFunctor;
    imuFunctor.setSamplingPeriod(dt);
    filter.setFunctor(& imuFunctor);

    ///the initalization of the estimation of the initial state
    filter.setState(xh0,y.getFirstIndex()-1);

    ///computation and initialization of the covariance matrix of the initial state
    filter.setStateCovariance(p);

    ///set initial input
    filter.setInput(u[y.getFirstIndex()-1],y.getFirstIndex()-1);

    ///The covariance matrix of the process noise and the measurement noise
    /// for the extended Kalman filter
    filter.setR(r);
    filter.setQ(q);

    ///set the derivation step for the finite difference method
    Vector dx=filter.stateVectorConstant(1)*1e-8;

    ///the array of the state estimations over time
    IndexedMatrixArray xh;
    xh.setValue(xh0,y.getFirstIndex()-1);

    ///the reconstruction of the state
    for (unsigned i=y.getFirstIndex();i<=y.getLastIndex();++i)
    {
        ///introduction of the measurement
        filter.setMeasurement(y[i],i);

        ///introduction of the input
        if (i<y.getLastIndex())
            filter.setInput(u[i],i);

        ///get the jacobians by finite differences and provide
        ///them to the Kalman filter
        Matrix a=filter.getAMatrixFD(dx);
        Matrix c= filter.getCMatrixFD(dx);
        filter.setA(a);
        filter.setC(c);

        ///get the estimation and give it to the array
        Vector xhk=filter.getEstimatedState(i);

        ///regulate the part of orientation vector in the state vector
        xhk.segment(kine::ori,3)=kine::regulateOrientationVector
                                                    (xhk.segment(kine::ori,3));

        ///give the new value of the state to the kalman filter.
        ///This step is usually unnecessary, unless we modify the
        ///value of the state esimation which is the case here.
        filter.setState(xhk,i);

        xh.setValue(xhk,i);
    }

    return xh;
}